

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int nni_pipe_alloc_listener(void **datap,nni_listener *l)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  nni_pipe *local_18;
  nni_pipe *p;
  
  local_18 = (nni_pipe *)CONCAT44(in_register_00000004,in_EAX);
  iVar1 = pipe_create(&local_18,l->l_sock,l->l_tran,(nni_dialer *)0x0,l);
  if (iVar1 == 0) {
    *datap = local_18->p_tran_data;
  }
  return iVar1;
}

Assistant:

int
nni_pipe_alloc_listener(void **datap, nni_listener *l)
{
	int          rv;
	nni_sp_tran *tran = l->l_tran;
	nni_sock    *s    = l->l_sock;
	nni_pipe    *p;

	if ((rv = pipe_create(&p, s, tran, NULL, l)) != 0) {
		return (rv);
	}
	*datap = p->p_tran_data;
	return (0);
}